

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fields.c
# Opt level: O0

void destroy2Dfield(void **field,int sizeX)

{
  int in_ESI;
  void *in_RDI;
  int i;
  undefined4 local_10;
  
  if (in_RDI != (void *)0x0) {
    for (local_10 = 0; local_10 < in_ESI; local_10 = local_10 + 1) {
      destroy1Dfield((void *)0x1028dc);
    }
    free(in_RDI);
  }
  return;
}

Assistant:

void destroy2Dfield (void** field, int sizeX)
{
	if (field == NULL)
		return;
	for (int i = 0; i < sizeX; i++)
	{
		destroy1Dfield((void*)field[i]);
	}
	free(field);
	return;
}